

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::ColumnMetaData::printTo(ColumnMetaData *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _ColumnMetaData__isset _Var2;
  type *val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *t;
  type *val_00;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ColumnMetaData(",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(out,"type=",5);
  to_string_abi_cxx11_(&local_128,(duckdb_parquet *)&this->type,val);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  paVar1 = &local_128.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"encodings=",10);
  duckdb_apache::thrift::to_string<duckdb_parquet::Encoding::type>(&local_128,&this->encodings);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"path_in_schema=",0xf);
  duckdb_apache::thrift::to_string<std::__cxx11::string>
            (&local_128,(thrift *)&this->path_in_schema,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"codec=",6);
  to_string_abi_cxx11_(&local_128,(duckdb_parquet *)&this->codec,val_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"num_values=",0xb);
  duckdb_apache::thrift::to_string<long>(&local_128,&this->num_values);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"total_uncompressed_size=",0x18);
  duckdb_apache::thrift::to_string<long>(&local_128,&this->total_uncompressed_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"total_compressed_size=",0x16);
  duckdb_apache::thrift::to_string<long>(&local_128,&this->total_compressed_size);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"key_value_metadata=",0x13);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::KeyValue>(&local_128,&this->key_value_metadata)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_128._M_dataplus._M_p,local_128._M_string_length);
  }
  if ((((byte)_Var2 & 1) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1)) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"data_page_offset=",0x11);
  duckdb_apache::thrift::to_string<long>(&local_108,&this->data_page_offset);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_108._M_dataplus._M_p,local_108._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"index_page_offset=",0x12);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_108,&this->index_page_offset);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_108._M_dataplus._M_p,local_108._M_string_length);
  }
  if ((((byte)_Var2 & 2) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2)) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"dictionary_page_offset=",0x17);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_48,&this->dictionary_page_offset);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_48._M_dataplus._M_p,local_48._M_string_length);
  }
  if ((((byte)_Var2 & 4) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"statistics=",0xb);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::Statistics>(&local_68,&this->statistics);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((((byte)_Var2 & 8) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"encoding_stats=",0xf);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<duckdb_parquet::PageEncodingStats>
              (&local_88,&this->encoding_stats);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_88._M_dataplus._M_p,local_88._M_string_length);
  }
  if ((((byte)_Var2 & 0x10) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2)) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"bloom_filter_offset=",0x14);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 0x20) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<long>(&local_a8,&this->bloom_filter_offset);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  }
  if ((((byte)_Var2 & 0x20) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2)) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"bloom_filter_length=",0x14);
  _Var2 = this->__isset;
  if (((byte)_Var2 & 0x40) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    duckdb_apache::thrift::to_string<int>(&local_c8,&this->bloom_filter_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  }
  if ((((byte)_Var2 & 0x40) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"size_statistics=",0x10);
  if ((char)this->__isset < '\0') {
    duckdb_apache::thrift::to_string<duckdb_parquet::SizeStatistics>
              (&local_e8,&this->size_statistics);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void ColumnMetaData::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "ColumnMetaData(";
  out << "type=" << to_string(type);
  out << ", " << "encodings=" << to_string(encodings);
  out << ", " << "path_in_schema=" << to_string(path_in_schema);
  out << ", " << "codec=" << to_string(codec);
  out << ", " << "num_values=" << to_string(num_values);
  out << ", " << "total_uncompressed_size=" << to_string(total_uncompressed_size);
  out << ", " << "total_compressed_size=" << to_string(total_compressed_size);
  out << ", " << "key_value_metadata="; (__isset.key_value_metadata ? (out << to_string(key_value_metadata)) : (out << "<null>"));
  out << ", " << "data_page_offset=" << to_string(data_page_offset);
  out << ", " << "index_page_offset="; (__isset.index_page_offset ? (out << to_string(index_page_offset)) : (out << "<null>"));
  out << ", " << "dictionary_page_offset="; (__isset.dictionary_page_offset ? (out << to_string(dictionary_page_offset)) : (out << "<null>"));
  out << ", " << "statistics="; (__isset.statistics ? (out << to_string(statistics)) : (out << "<null>"));
  out << ", " << "encoding_stats="; (__isset.encoding_stats ? (out << to_string(encoding_stats)) : (out << "<null>"));
  out << ", " << "bloom_filter_offset="; (__isset.bloom_filter_offset ? (out << to_string(bloom_filter_offset)) : (out << "<null>"));
  out << ", " << "bloom_filter_length="; (__isset.bloom_filter_length ? (out << to_string(bloom_filter_length)) : (out << "<null>"));
  out << ", " << "size_statistics="; (__isset.size_statistics ? (out << to_string(size_statistics)) : (out << "<null>"));
  out << ")";
}